

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

FARPROC GetProcAddress(HMODULE hModule,LPCSTR lpProcName)

{
  undefined8 uVar1;
  long lVar2;
  LPCSTR ProcAddress_00;
  MODSTRUCT *pMVar3;
  BOOL BVar4;
  errno_t eVar5;
  size_t sVar6;
  char *pcVar7;
  LPWSTR pWVar8;
  LPCSTR *_Dst;
  size_t sVar9;
  long in_FS_OFFSET;
  undefined8 uStack_60;
  LPCSTR local_58;
  char *local_50;
  char *libName;
  LPSTR lpPALProcName;
  LPCSTR pCStack_38;
  int iLen;
  LPCSTR symbolName;
  FARPROC ProcAddress;
  MODSTRUCT *module;
  LPCSTR lpProcName_local;
  HMODULE hModule_local;
  
  _Dst = &local_58;
  hModule_local = *(HMODULE *)(in_FS_OFFSET + 0x28);
  symbolName = (LPCSTR)0x0;
  pCStack_38 = lpProcName;
  module = (MODSTRUCT *)lpProcName;
  lpProcName_local = (LPCSTR)hModule;
  if (!PAL_InitializeChakraCoreCalled) {
    uStack_60 = 0x23937e;
    abort();
  }
  uStack_60 = 0x2393a1;
  LockModuleList();
  ProcAddress = (FARPROC)lpProcName_local;
  if ((module == (MODSTRUCT *)0x0) || (*(char *)&module->self == '\0')) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      uStack_60 = 0x2393cd;
      abort();
    }
    uStack_60 = 0x2393d7;
    SetLastError(0x57);
    _Dst = &local_58;
  }
  else {
    uStack_60 = 0x2393e5;
    BVar4 = LOADValidateModule((MODSTRUCT *)lpProcName_local);
    if (BVar4 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        uStack_60 = 0x2393fb;
        abort();
      }
      uStack_60 = 0x239405;
      SetLastError(6);
    }
    else {
      if (module < (MODSTRUCT *)0x1000) {
        uStack_60 = 0x239442;
        fprintf(_stderr,"] %s %s:%d","GetProcAddress",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
                ,0x136);
        uStack_60 = 0x23945a;
        fprintf(_stderr,"Attempt to locate symbol by ordinal?!\n");
      }
      _Dst = &local_58;
      if ((pal_module != (MODSTRUCT *)0x0) &&
         (_Dst = &local_58, *(void **)(ProcAddress + 8) == pal_module->dl_handle)) {
        uStack_60 = 0x239490;
        sVar6 = strlen((char *)module);
        lpPALProcName._4_4_ = (int)sVar6 + 5;
        lVar2 = -((long)lpPALProcName._4_4_ + 0xfU & 0xfffffffffffffff0);
        _Dst = (LPCSTR *)((long)&local_58 + lVar2);
        sVar9 = (size_t)lpPALProcName._4_4_;
        libName = (char *)_Dst;
        *(undefined8 *)((long)&uStack_60 + lVar2) = 0x2394c3;
        eVar5 = strcpy_s((char *)_Dst,sVar9,"PAL_");
        pMVar3 = module;
        pcVar7 = libName;
        if (eVar5 != 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            *(undefined8 *)((long)&uStack_60 + lVar2) = 0x2394d9;
            abort();
          }
          *(undefined8 *)((long)&uStack_60 + lVar2) = 0x2394e3;
          SetLastError(0x7a);
          goto LAB_00239610;
        }
        sVar9 = (size_t)lpPALProcName._4_4_;
        *(undefined8 *)((long)&uStack_60 + lVar2) = 0x2394f9;
        eVar5 = strcat_s(pcVar7,sVar9,(char *)pMVar3);
        pcVar7 = libName;
        if (eVar5 != 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            *(undefined8 *)((long)&uStack_60 + lVar2) = 0x23950f;
            abort();
          }
          *(undefined8 *)((long)&uStack_60 + lVar2) = 0x239519;
          SetLastError(0x7a);
          goto LAB_00239610;
        }
        uVar1 = *(undefined8 *)(ProcAddress + 8);
        *(undefined8 *)((long)&uStack_60 + lVar2) = 0x23952f;
        symbolName = (LPCSTR)dlsym(uVar1,pcVar7);
        pCStack_38 = libName;
      }
      pMVar3 = module;
      if (symbolName == (LPCSTR)0x0) {
        uVar1 = *(undefined8 *)(ProcAddress + 8);
        *(char *)((long)_Dst + -8) = 'S';
        *(char *)((long)_Dst + -7) = -0x6b;
        *(char *)((long)_Dst + -6) = '#';
        *(char *)((long)_Dst + -5) = '\0';
        *(char *)((long)_Dst + -4) = '\0';
        *(char *)((long)_Dst + -3) = '\0';
        *(char *)((long)_Dst + -2) = '\0';
        *(char *)((long)_Dst + -1) = '\0';
        symbolName = (LPCSTR)dlsym(uVar1,pMVar3);
      }
      ProcAddress_00 = symbolName;
      if (symbolName == (LPCSTR)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          *(char *)((long)_Dst + -8) = -1;
          *(char *)((long)_Dst + -7) = -0x6b;
          *(char *)((long)_Dst + -6) = '#';
          *(char *)((long)_Dst + -5) = '\0';
          *(char *)((long)_Dst + -4) = '\0';
          *(char *)((long)_Dst + -3) = '\0';
          *(char *)((long)_Dst + -2) = '\0';
          *(char *)((long)_Dst + -1) = '\0';
          abort();
        }
        *(char *)((long)_Dst + -8) = '\x04';
        *(char *)((long)_Dst + -7) = -0x6a;
        *(char *)((long)_Dst + -6) = '#';
        *(char *)((long)_Dst + -5) = '\0';
        *(char *)((long)_Dst + -4) = '\0';
        *(char *)((long)_Dst + -3) = '\0';
        *(char *)((long)_Dst + -2) = '\0';
        *(char *)((long)_Dst + -1) = '\0';
        dlerror();
        *(char *)((long)_Dst + -8) = '\x0e';
        *(char *)((long)_Dst + -7) = -0x6a;
        *(char *)((long)_Dst + -6) = '#';
        *(char *)((long)_Dst + -5) = '\0';
        *(char *)((long)_Dst + -4) = '\0';
        *(char *)((long)_Dst + -3) = '\0';
        *(char *)((long)_Dst + -2) = '\0';
        *(char *)((long)_Dst + -1) = '\0';
        SetLastError(0x7f);
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          *(char *)((long)_Dst + -8) = 's';
          *(char *)((long)_Dst + -7) = -0x6b;
          *(char *)((long)_Dst + -6) = '#';
          *(char *)((long)_Dst + -5) = '\0';
          *(char *)((long)_Dst + -4) = '\0';
          *(char *)((long)_Dst + -3) = '\0';
          *(char *)((long)_Dst + -2) = '\0';
          *(char *)((long)_Dst + -1) = '\0';
          abort();
        }
        if ((*(long *)(ProcAddress + 0x18) == 0) && (*(long *)(ProcAddress + 8) != 0)) {
          *(char *)((long)_Dst + -8) = -0x6e;
          *(char *)((long)_Dst + -7) = -0x6b;
          *(char *)((long)_Dst + -6) = '#';
          *(char *)((long)_Dst + -5) = '\0';
          *(char *)((long)_Dst + -4) = '\0';
          *(char *)((long)_Dst + -3) = '\0';
          *(char *)((long)_Dst + -2) = '\0';
          *(char *)((long)_Dst + -1) = '\0';
          pcVar7 = PAL_dladdr(ProcAddress_00);
          local_50 = pcVar7;
          if (pcVar7 != (char *)0x0) {
            *(char *)((long)_Dst + -8) = -0x55;
            *(char *)((long)_Dst + -7) = -0x6b;
            *(char *)((long)_Dst + -6) = '#';
            *(char *)((long)_Dst + -5) = '\0';
            *(char *)((long)_Dst + -4) = '\0';
            *(char *)((long)_Dst + -3) = '\0';
            *(char *)((long)_Dst + -2) = '\0';
            *(char *)((long)_Dst + -1) = '\0';
            pWVar8 = UTIL_MBToWC_Alloc(pcVar7,-1);
            *(LPWSTR *)(ProcAddress + 0x18) = pWVar8;
            if (*(long *)(ProcAddress + 0x18) == 0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                builtin_strncpy((char *)((long)_Dst + -8),"ӕ#",4);
                *(char *)((long)_Dst + -4) = '\0';
                *(char *)((long)_Dst + -3) = '\0';
                *(char *)((long)_Dst + -2) = '\0';
                *(char *)((long)_Dst + -1) = '\0';
                abort();
              }
            }
            else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              *(char *)((long)_Dst + -8) = -0x1a;
              *(char *)((long)_Dst + -7) = -0x6b;
              *(char *)((long)_Dst + -6) = '#';
              *(char *)((long)_Dst + -5) = '\0';
              *(char *)((long)_Dst + -4) = '\0';
              *(char *)((long)_Dst + -3) = '\0';
              *(char *)((long)_Dst + -2) = '\0';
              *(char *)((long)_Dst + -1) = '\0';
              abort();
            }
          }
        }
      }
    }
  }
LAB_00239610:
  *(char *)((long)_Dst + -8) = '\x15';
  *(char *)((long)_Dst + -7) = -0x6a;
  *(char *)((long)_Dst + -6) = '#';
  *(char *)((long)_Dst + -5) = '\0';
  *(char *)((long)_Dst + -4) = '\0';
  *(char *)((long)_Dst + -3) = '\0';
  *(char *)((long)_Dst + -2) = '\0';
  *(char *)((long)_Dst + -1) = '\0';
  UnlockModuleList();
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    *(char *)((long)_Dst + -8) = '&';
    *(char *)((long)_Dst + -7) = -0x6a;
    *(char *)((long)_Dst + -6) = '#';
    *(char *)((long)_Dst + -5) = '\0';
    *(char *)((long)_Dst + -4) = '\0';
    *(char *)((long)_Dst + -3) = '\0';
    *(char *)((long)_Dst + -2) = '\0';
    *(char *)((long)_Dst + -1) = '\0';
    abort();
  }
  local_58 = symbolName;
  if (*(HMODULE *)(in_FS_OFFSET + 0x28) != hModule_local) {
    *(char *)((long)_Dst + -8) = 'N';
    *(char *)((long)_Dst + -7) = -0x6a;
    *(char *)((long)_Dst + -6) = '#';
    *(char *)((long)_Dst + -5) = '\0';
    *(char *)((long)_Dst + -4) = '\0';
    *(char *)((long)_Dst + -3) = '\0';
    *(char *)((long)_Dst + -2) = '\0';
    *(char *)((long)_Dst + -1) = '\0';
    __stack_chk_fail();
  }
  return (FARPROC)symbolName;
}

Assistant:

FARPROC
PALAPI
GetProcAddress(
    IN HMODULE hModule,
    IN LPCSTR lpProcName)
{
    MODSTRUCT *module;
    FARPROC ProcAddress = nullptr;
    LPCSTR symbolName = lpProcName;

    PERF_ENTRY(GetProcAddress);
    ENTRY("GetProcAddress (hModule=%p, lpProcName=%p (%s))\n",
          hModule, lpProcName ? lpProcName : "NULL", lpProcName ? lpProcName : "NULL");

    LockModuleList();

    module = (MODSTRUCT *) hModule;

    /* parameter validation */

    if ((lpProcName == nullptr) || (*lpProcName == '\0'))
    {
        TRACE("No function name given\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (!LOADValidateModule(module))
    {
        TRACE("Invalid module handle %p\n", hModule);
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }

    /* try to assert on attempt to locate symbol by ordinal */
    /* this can't be an exact test for HIWORD((DWORD)lpProcName) == 0
       because of the address range reserved for ordinals contain can
       be a valid string address on non-Windows systems
    */
    if ((DWORD_PTR)lpProcName < VIRTUAL_PAGE_SIZE)
    {
        ASSERT("Attempt to locate symbol by ordinal?!\n");
    }

    // Get the symbol's address.

    // If we're looking for a symbol inside the PAL, we try the PAL_ variant
    // first because otherwise we run the risk of having the non-PAL_
    // variant preferred over the PAL's implementation.
    if (pal_module && module->dl_handle == pal_module->dl_handle)
    {
        int iLen = 4 + strlen(lpProcName) + 1;
        LPSTR lpPALProcName = (LPSTR) alloca(iLen);

        if (strcpy_s(lpPALProcName, iLen, "PAL_") != SAFECRT_SUCCESS)
        {
            ERROR("strcpy_s failed!\n");
            SetLastError(ERROR_INSUFFICIENT_BUFFER);
            goto done;
        }

        if (strcat_s(lpPALProcName, iLen, lpProcName) != SAFECRT_SUCCESS)
        {
            ERROR("strcat_s failed!\n");
            SetLastError(ERROR_INSUFFICIENT_BUFFER);
            goto done;
        }

        ProcAddress = (FARPROC) dlsym(module->dl_handle, lpPALProcName);
        symbolName = lpPALProcName;
    }

    // If we aren't looking inside the PAL or we didn't find a PAL_ variant
    // inside the PAL, fall back to a normal search.
    if (ProcAddress == nullptr)
    {
        ProcAddress = (FARPROC) dlsym(module->dl_handle, lpProcName);
    }

    if (ProcAddress)
    {
        TRACE("Symbol %s found at address %p in module %p (named %S)\n",
              lpProcName, ProcAddress, module, MODNAME(module));

        /* if we don't know the module's full name yet, this is our chance to obtain it */
        if (!module->lib_name && module->dl_handle)
        {
            const char* libName = PAL_dladdr((LPVOID)ProcAddress);
            if (libName)
            {
                module->lib_name = UTIL_MBToWC_Alloc(libName, -1);
                if (nullptr == module->lib_name)
                {
                    ERROR("MBToWC failure; can't save module's full name\n");
                }
                else
                {
                    TRACE("Saving full path of module %p as %s\n",
                          module, libName);
                }
            }
        }
    }
    else
    {
        TRACE("Symbol %s not found in module %p (named %S), dlerror message is \"%s\"\n",
              lpProcName, module, MODNAME(module), dlerror());
        SetLastError(ERROR_PROC_NOT_FOUND);
    }
done:
    UnlockModuleList();
    LOGEXIT("GetProcAddress returns FARPROC %p\n", ProcAddress);
    PERF_EXIT(GetProcAddress);
    return ProcAddress;
}